

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaVCheckINodeDataType
              (xmlSchemaValidCtxtPtr vctxt,xmlSchemaNodeInfoPtr inode,xmlSchemaTypePtr type,
              xmlChar *value)

{
  int iVar1;
  xmlSchemaValPtr *retVal;
  bool bVar2;
  
  bVar2 = (inode->flags & 0x10) != 0;
  if (bVar2) {
    retVal = &inode->val;
  }
  else {
    retVal = (xmlSchemaValPtr *)0x0;
  }
  iVar1 = xmlSchemaVCheckCVCSimpleType
                    ((xmlSchemaAbstractCtxtPtr)vctxt,(xmlNodePtr)0x0,type,value,retVal,1,(uint)bVar2
                     ,0);
  return iVar1;
}

Assistant:

static int
xmlSchemaVCheckINodeDataType(xmlSchemaValidCtxtPtr vctxt,
			     xmlSchemaNodeInfoPtr inode,
			     xmlSchemaTypePtr type,
			     const xmlChar *value)
{
    if (inode->flags & XML_SCHEMA_NODE_INFO_VALUE_NEEDED)
	return (xmlSchemaVCheckCVCSimpleType(
	    ACTXT_CAST vctxt, NULL,
	    type, value, &(inode->val), 1, 1, 0));
    else
	return (xmlSchemaVCheckCVCSimpleType(
	    ACTXT_CAST vctxt, NULL,
	    type, value, NULL, 1, 0, 0));
}